

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsPopupOpen(ImGuiID id,ImGuiPopupFlags popup_flags)

{
  ImVector<ImGuiPopupData> *this;
  int iVar1;
  ImGuiPopupData_conflict1 *pIVar2;
  int n;
  int iVar3;
  bool bVar4;
  bool bVar5;
  
  if ((char)popup_flags < '\0') {
    if (id != 0) {
      __assert_fail("id == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x22c2,"bool ImGui::IsPopupOpen(ImGuiID, ImGuiPopupFlags)");
    }
    iVar3 = (GImGui->OpenPopupStack).Size;
    if (((uint)popup_flags >> 8 & 1) == 0) {
      iVar1 = (GImGui->BeginPopupStack).Size;
      bVar5 = SBORROW4(iVar3,iVar1);
      bVar4 = iVar3 == iVar1;
      iVar3 = iVar3 - iVar1;
    }
    else {
      bVar5 = false;
      bVar4 = iVar3 == 0;
    }
    bVar4 = !bVar4 && bVar5 == iVar3 < 0;
  }
  else {
    this = &GImGui->OpenPopupStack;
    if (((uint)popup_flags >> 8 & 1) == 0) {
      iVar3 = (GImGui->BeginPopupStack).Size;
      if (iVar3 < (GImGui->OpenPopupStack).Size) {
        pIVar2 = ImVector<ImGuiPopupData>::operator[](this,iVar3);
        bVar4 = pIVar2->PopupId == id;
      }
      else {
        bVar4 = false;
      }
    }
    else {
      iVar3 = 0;
      do {
        bVar4 = iVar3 < this->Size;
        if (this->Size <= iVar3) {
          return bVar4;
        }
        pIVar2 = ImVector<ImGuiPopupData>::operator[](this,iVar3);
        iVar3 = iVar3 + 1;
      } while (pIVar2->PopupId != id);
    }
  }
  return bVar4;
}

Assistant:

bool ImGui::IsPopupOpen(ImGuiID id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    if (popup_flags & ImGuiPopupFlags_AnyPopupId)
    {
        // Return true if any popup is open at the current BeginPopup() level of the popup stack
        // This may be used to e.g. test for another popups already opened to handle popups priorities at the same level.
        IM_ASSERT(id == 0);
        if (popup_flags & ImGuiPopupFlags_AnyPopupLevel)
            return g.OpenPopupStack.Size > 0;
        else
            return g.OpenPopupStack.Size > g.BeginPopupStack.Size;
    }
    else
    {
        if (popup_flags & ImGuiPopupFlags_AnyPopupLevel)
        {
            // Return true if the popup is open anywhere in the popup stack
            for (int n = 0; n < g.OpenPopupStack.Size; n++)
                if (g.OpenPopupStack[n].PopupId == id)
                    return true;
            return false;
        }
        else
        {
            // Return true if the popup is open at the current BeginPopup() level of the popup stack (this is the most-common query)
            return g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].PopupId == id;
        }
    }
}